

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvdir.c
# Opt level: O2

int main(int argc,char **argv)

{
  __time_t _Var1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  iopause_fd *x;
  char **ppcVar8;
  int *piVar9;
  char ch;
  int local_11c;
  long local_118;
  int wstat;
  taia stampcheck;
  taia deadline;
  taia now;
  stat s;
  
  ppcVar8 = argv + 1;
  progname = *argv;
  pcVar7 = argv[1];
  if (pcVar7 == (char *)0x0) {
    usage();
    pcVar7 = *ppcVar8;
  }
  if (*pcVar7 == '-') {
    if (pcVar7[1] != '-') {
      if (pcVar7[1] != 'P') goto LAB_00102831;
      pgrp = 1;
    }
    ppcVar8 = argv + 2;
    if (argv[2] == (char *)0x0) {
      usage();
    }
  }
LAB_00102831:
  sig_catch(sig_term,s_term);
  sig_catch(sig_hangup,s_hangup);
  svdir = *ppcVar8;
  if ((ppcVar8[1] != (char *)0x0) && (rplog = ppcVar8[1], iVar2 = setup_log(), iVar2 != 1)) {
    rplog = (char *)0x0;
    warn3x("log service disabled.",(char *)0x0,(char *)0x0);
  }
  local_11c = open_read(".");
  if (local_11c == -1) {
    fatal("unable to open current directory",(char *)0x0);
  }
  coe(local_11c);
  taia_now(&stampcheck);
  local_118 = 0;
LAB_001028ed:
  do {
    iVar2 = wait_nohang(&wstat);
    if (0 < iVar2) {
      uVar4 = (ulong)(uint)svnum;
      if (svnum < 1) {
        uVar4 = 0;
      }
      lVar5 = -0x18;
      do {
        lVar6 = lVar5;
        if (uVar4 * 0x18 - (lVar6 + 0x18) == 0) goto LAB_001028ed;
        lVar5 = lVar6 + 0x18;
      } while (iVar2 != *(int *)((long)&sv[1].pid + lVar6));
      *(undefined4 *)((long)&sv[1].pid + lVar6) = 0;
      check = 1;
      goto LAB_001028ed;
    }
    taia_now(&now);
    if (now.sec.x < stampcheck.sec.x - 3) {
      warn3x("time warp: resetting time stamp.",(char *)0x0,(char *)0x0);
      taia_now(&stampcheck);
      taia_now(&now);
      if (rplog != (char *)0x0) {
        taia_now(&stamplog);
      }
    }
    iVar2 = taia_less(&now,&stampcheck);
    if (iVar2 == 0) {
      taia_uint(&deadline,1);
      taia_add(&stampcheck,&now,&deadline);
      iVar2 = stat(svdir,(stat *)&s);
      _Var1 = s.st_mtim.tv_sec;
      pcVar7 = "unable to stat ";
      if (iVar2 == -1) {
LAB_00102aac:
        warn(pcVar7,svdir);
      }
      else if (((s.st_mtim.tv_sec != local_118 || check != 0) || (s.st_ino != ino)) ||
              (s.st_dev != dev)) {
        iVar2 = chdir(svdir);
        pcVar7 = "unable to change directory to ";
        if (iVar2 == -1) goto LAB_00102aac;
        dev = s.st_dev;
        check = 0;
        ino = s.st_ino;
        local_118 = _Var1;
        if (now.sec.x <= _Var1 + 0x400000000000000aU) {
          sleep(1);
        }
        runsvdir();
        while (iVar2 = fchdir(local_11c), iVar2 == -1) {
          warn("unable to change directory, pausing",(char *)0x0);
          sleep(5);
        }
      }
    }
    if ((rplog != (char *)0x0) && (iVar2 = taia_less(&now,&stamplog), iVar2 == 0)) {
      write(logpipe[1],".",1);
      taia_uint(&deadline,900);
      taia_add(&stamplog,&now,&deadline);
    }
    taia_uint(&deadline,(uint)(check == 0) * 4 + 1);
    taia_add(&deadline,&now,&deadline);
    sig_block(sig_child);
    if (rplog == (char *)0x0) {
      x = (iopause_fd *)0x0;
    }
    else {
      x = io;
    }
    iopause(x,(uint)(rplog != (char *)0x0),&deadline,&now);
    sig_unblock(sig_child);
    if (rplog != (char *)0x0) {
      while (sVar3 = read(logpipe[0],&ch,1), 0 < sVar3) {
        if (ch != '\0') {
          for (lVar5 = 6; lVar5 < rploglen; lVar5 = lVar5 + 1) {
            rplog[lVar5 + -1] = rplog[lVar5];
          }
          rplog[(long)rploglen + -1] = ch;
        }
      }
    }
    if (exitsoon == 1) {
      _exit(0);
    }
    if (exitsoon == 2) {
      piVar9 = &sv[0].pid;
      iVar2 = svnum;
      for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
        if (*piVar9 != 0) {
          kill(*piVar9,0xf);
          iVar2 = svnum;
        }
        piVar9 = piVar9 + 6;
      }
      _exit(0x6f);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  struct stat s;
  time_t mtime =0;
  int wstat;
  int curdir;
  int pid;
  struct taia deadline;
  struct taia now;
  struct taia stampcheck;
  char ch;
  int i;

  progname =*argv++;
  if (! argv || ! *argv) usage();
  if (**argv == '-') {
    switch (*(*argv +1)) {
    case 'P': pgrp =1;
    case '-': ++argv;
    }
    if (! argv || ! *argv) usage();
  }

  sig_catch(sig_term, s_term);
  sig_catch(sig_hangup, s_hangup);
  svdir =*argv++;
  if (argv && *argv) {
    rplog =*argv;
    if (setup_log() != 1) {
      rplog =0;
      warn3x("log service disabled.", 0, 0);
    }
  }
  if ((curdir =open_read(".")) == -1)
    fatal("unable to open current directory", 0);
  coe(curdir);

  taia_now(&stampcheck);

  for (;;) {
    /* collect children */
    for (;;) {
      if ((pid =wait_nohang(&wstat)) <= 0) break;
      for (i =0; i < svnum; i++) {
        if (pid == sv[i].pid) {
          /* runsv has gone */
          sv[i].pid =0;
          check =1;
          break;
        }
      }
    }

    taia_now(&now);
    if (now.sec.x < (stampcheck.sec.x -3)) {
      /* time warp */
      warn3x("time warp: resetting time stamp.", 0, 0);
      taia_now(&stampcheck);
      taia_now(&now);
      if (rplog) taia_now(&stamplog);
    }
    if (taia_less(&now, &stampcheck) == 0) {
      /* wait at least a second */
      taia_uint(&deadline, 1);
      taia_add(&stampcheck, &now, &deadline);

      if (stat(svdir, &s) != -1) {
        if (check || \
            s.st_mtime != mtime || s.st_ino != ino || s.st_dev != dev) {
          /* svdir modified */
          if (chdir(svdir) != -1) {
            mtime =s.st_mtime;
            dev =s.st_dev;
            ino =s.st_ino;
            check =0;
            if (now.sec.x <= (4611686018427387914ULL +(uint64)mtime))
              sleep(1);
            runsvdir();
            while (fchdir(curdir) == -1) {
              warn("unable to change directory, pausing", 0);
              sleep(5);
            }
          }
          else
            warn("unable to change directory to ", svdir);
        }
      }
      else
        warn("unable to stat ", svdir);
    }

    if (rplog)
      if (taia_less(&now, &stamplog) == 0) {
        write(logpipe[1], ".", 1);
        taia_uint(&deadline, 900);
        taia_add(&stamplog, &now, &deadline);
      }
    taia_uint(&deadline, check ? 1 : 5);
    taia_add(&deadline, &now, &deadline);

    sig_block(sig_child);
    if (rplog)
      iopause(io, 1, &deadline, &now);
    else
      iopause(0, 0, &deadline, &now);
    sig_unblock(sig_child);

    if (rplog && (io[0].revents | IOPAUSE_READ))
      while (read(logpipe[0], &ch, 1) > 0)
        if (ch) {
          for (i =6; i < rploglen; i++)
            rplog[i -1] =rplog[i];
          rplog[rploglen -1] =ch;
        }

    switch(exitsoon) {
    case 1:
      _exit(0);
    case 2:
      for (i =0; i < svnum; i++) if (sv[i].pid) kill(sv[i].pid, SIGTERM);
      _exit(111);
    }
  }
  /* not reached */
  _exit(0);
}